

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose.hpp
# Opt level: O2

void qclab::dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<float>>>
               (Op op,SquareMatrix<std::complex<float>_> *A)

{
  long lVar1;
  complex<float> *pcVar2;
  _ComplexT _Var3;
  long lVar4;
  long lVar5;
  long lVar6;
  int64_t i;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if (op != NoTrans) {
    lVar1 = A->size_;
    if (op == ConjTrans) {
      lVar4 = 0;
      lVar5 = 0;
      if (0 < lVar1) {
        lVar5 = lVar1;
      }
      for (lVar6 = 0; lVar6 != lVar5; lVar6 = lVar6 + 1) {
        for (lVar7 = 0; lVar1 != lVar7; lVar7 = lVar7 + 1) {
          lVar8 = A->size_ * lVar4;
          pcVar2 = (A->data_)._M_t.
                   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                   .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
          *(ulong *)((long)&pcVar2[lVar7]._M_value + lVar8) =
               CONCAT44(*(undefined4 *)((long)&pcVar2[lVar7]._M_value + lVar8 + 4),
                        (int)*(_ComplexT *)((long)&pcVar2[lVar7]._M_value + lVar8)) ^
               0x8000000000000000;
        }
        lVar4 = lVar4 + 8;
      }
    }
    lVar5 = 1;
    if (1 < lVar1) {
      lVar5 = lVar1;
    }
    lVar6 = 0;
    lVar4 = 0;
    while (lVar4 != lVar5 + -1) {
      for (lVar7 = lVar4 + 1; lVar7 < lVar1; lVar7 = lVar7 + 1) {
        pcVar2 = (A->data_)._M_t.
                 super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                 .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
        lVar8 = lVar6 * A->size_;
        lVar9 = A->size_ * lVar7;
        _Var3 = *(_ComplexT *)((long)&pcVar2[lVar7]._M_value + lVar8);
        *(_ComplexT *)((long)&pcVar2[lVar7]._M_value + lVar8) = pcVar2[lVar9 + lVar4]._M_value;
        pcVar2[lVar9 + lVar4]._M_value = _Var3;
      }
      lVar6 = lVar6 + 8;
      lVar4 = lVar4 + 1;
    }
  }
  return;
}

Assistant:

void operateInPlace( Op op , T& A ) {
      if ( op == Op::NoTrans ) return ;
      const int64_t rows = A.rows() ;
      const int64_t cols = A.cols() ;
      if constexpr ( qclab::is_complex_v< typename T::value_type > ) {
        if ( op == Op::ConjTrans ) {
          // conjugate
          #pragma omp parallel for
          for ( int64_t j = 0; j < cols; j++ ) {
            for ( int64_t i = 0; i < rows; i++ ) {
              A(i,j) = std::conj( A(i,j) ) ;
            }
          }
        }
      }
      // transpose
      #pragma omp parallel for
      for ( int64_t j = 0; j < cols - 1; j++ ) {
        for ( int64_t i = j + 1; i < rows; i++ ) {
          std::swap( A(i,j) , A(j,i) ) ;
        }
      }
    }